

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O0

void png_write_destroy(png_structrp png_ptr)

{
  png_structrp png_ptr_local;
  
  if ((png_ptr->flags & 2) != 0) {
    deflateEnd(&png_ptr->zstream);
  }
  png_free_buffer_list(png_ptr,&png_ptr->zbuffer_list);
  png_free(png_ptr,png_ptr->row_buf);
  png_ptr->row_buf = (png_bytep)0x0;
  png_free(png_ptr,png_ptr->prev_row);
  png_free(png_ptr,png_ptr->try_row);
  png_free(png_ptr,png_ptr->tst_row);
  png_ptr->prev_row = (png_bytep)0x0;
  png_ptr->try_row = (png_bytep)0x0;
  png_ptr->tst_row = (png_bytep)0x0;
  png_free(png_ptr,png_ptr->chunk_list);
  png_ptr->chunk_list = (png_bytep)0x0;
  return;
}

Assistant:

static void
png_write_destroy(png_structrp png_ptr)
{
   png_debug(1, "in png_write_destroy");

   /* Free any memory zlib uses */
   if ((png_ptr->flags & PNG_FLAG_ZSTREAM_INITIALIZED) != 0)
      deflateEnd(&png_ptr->zstream);

   /* Free our memory.  png_free checks NULL for us. */
   png_free_buffer_list(png_ptr, &png_ptr->zbuffer_list);
   png_free(png_ptr, png_ptr->row_buf);
   png_ptr->row_buf = NULL;
#ifdef PNG_READ_EXPANDED_SUPPORTED
   png_free(png_ptr, png_ptr->riffled_palette);
   png_ptr->riffled_palette = NULL;
#endif
#ifdef PNG_WRITE_FILTER_SUPPORTED
   png_free(png_ptr, png_ptr->prev_row);
   png_free(png_ptr, png_ptr->try_row);
   png_free(png_ptr, png_ptr->tst_row);
   png_ptr->prev_row = NULL;
   png_ptr->try_row = NULL;
   png_ptr->tst_row = NULL;
#endif

#ifdef PNG_SET_UNKNOWN_CHUNKS_SUPPORTED
   png_free(png_ptr, png_ptr->chunk_list);
   png_ptr->chunk_list = NULL;
#endif

   /* The error handling and memory handling information is left intact at this
    * point: the jmp_buf may still have to be freed.  See png_destroy_png_struct
    * for how this happens.
    */
}